

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb_fastpforlib::internal::__fastunpack55(uint32_t *in,uint64_t *out)

{
  uint32_t *local_8;
  
  local_8 = in;
  Unroller<(unsigned_short)55,_(unsigned_short)0>::Unpack(&local_8,out);
  return;
}

Assistant:

void __fastunpack55(const uint32_t *__restrict in, uint64_t *__restrict out) {
	Unroller<55>::Unpack(in, out);
}